

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_quaternion.cpp
# Opt level: O0

bool __thiscall ON_Quaternion::IsValid(ON_Quaternion *this)

{
  bool local_21;
  bool local_11;
  ON_Quaternion *this_local;
  
  local_11 = false;
  if ((((-1.23432101234321e+308 < this->a) &&
       (local_11 = false, this->a <= 1.23432101234321e+308 && this->a != 1.23432101234321e+308)) &&
      (local_11 = false, -1.23432101234321e+308 < this->b)) &&
     (((local_11 = false, this->b <= 1.23432101234321e+308 && this->b != 1.23432101234321e+308 &&
       (local_11 = false, -1.23432101234321e+308 < this->c)) &&
      (local_11 = false, this->c <= 1.23432101234321e+308 && this->c != 1.23432101234321e+308)))) {
    local_21 = false;
    if (-1.23432101234321e+308 < this->d) {
      local_21 = this->d <= 1.23432101234321e+308 && this->d != 1.23432101234321e+308;
    }
    local_11 = local_21;
  }
  return (bool)(-local_11 & 1);
}

Assistant:

bool ON_Quaternion::IsValid() const
{
  return ((ON_IS_VALID(a) && ON_IS_VALID(b) && ON_IS_VALID(c) && ON_IS_VALID(d)) ? true : false);
}